

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::Utils::getVariableTypeGLSLString_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,_variable_type *variable_type)

{
  TestError *this_00;
  allocator<char> local_1a;
  undefined1 local_19;
  Utils *local_18;
  _variable_type *variable_type_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  variable_type_local = (_variable_type *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?]",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  switch(*(undefined4 *)local_18) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bool");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bvec2");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bvec3");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"bvec4");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"double");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"dvec2");
    break;
  case 6:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"dvec3");
    break;
  case 7:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"dvec4");
    break;
  case 8:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"float");
    break;
  case 9:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"int");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ivec2");
    break;
  case 0xb:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ivec3");
    break;
  case 0xc:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ivec4");
    break;
  case 0xd:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat2");
    break;
  case 0xe:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat2x3");
    break;
  case 0xf:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat2x4");
    break;
  case 0x10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat3");
    break;
  case 0x11:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat3x2");
    break;
  case 0x12:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat3x4");
    break;
  case 0x13:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat4");
    break;
  case 0x14:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat4x2");
    break;
  case 0x15:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"mat4x3");
    break;
  case 0x16:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uint");
    break;
  case 0x17:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uvec2");
    break;
  case 0x18:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uvec3");
    break;
  case 0x19:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uvec4");
    break;
  case 0x1a:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"vec2");
    break;
  case 0x1b:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"vec3");
    break;
  case 0x1c:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"vec4");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized variable type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x680);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getVariableTypeGLSLString(const _variable_type& variable_type)
{
	std::string result = "[?]";

	switch (variable_type)
	{
	case VARIABLE_TYPE_BOOL:
		result = "bool";
		break;
	case VARIABLE_TYPE_BVEC2:
		result = "bvec2";
		break;
	case VARIABLE_TYPE_BVEC3:
		result = "bvec3";
		break;
	case VARIABLE_TYPE_BVEC4:
		result = "bvec4";
		break;
	case VARIABLE_TYPE_DOUBLE:
		result = "double";
		break;
	case VARIABLE_TYPE_DVEC2:
		result = "dvec2";
		break;
	case VARIABLE_TYPE_DVEC3:
		result = "dvec3";
		break;
	case VARIABLE_TYPE_DVEC4:
		result = "dvec4";
		break;
	case VARIABLE_TYPE_FLOAT:
		result = "float";
		break;
	case VARIABLE_TYPE_INT:
		result = "int";
		break;
	case VARIABLE_TYPE_IVEC2:
		result = "ivec2";
		break;
	case VARIABLE_TYPE_IVEC3:
		result = "ivec3";
		break;
	case VARIABLE_TYPE_IVEC4:
		result = "ivec4";
		break;
	case VARIABLE_TYPE_MAT2:
		result = "mat2";
		break;
	case VARIABLE_TYPE_MAT2X3:
		result = "mat2x3";
		break;
	case VARIABLE_TYPE_MAT2X4:
		result = "mat2x4";
		break;
	case VARIABLE_TYPE_MAT3:
		result = "mat3";
		break;
	case VARIABLE_TYPE_MAT3X2:
		result = "mat3x2";
		break;
	case VARIABLE_TYPE_MAT3X4:
		result = "mat3x4";
		break;
	case VARIABLE_TYPE_MAT4:
		result = "mat4";
		break;
	case VARIABLE_TYPE_MAT4X2:
		result = "mat4x2";
		break;
	case VARIABLE_TYPE_MAT4X3:
		result = "mat4x3";
		break;
	case VARIABLE_TYPE_UINT:
		result = "uint";
		break;
	case VARIABLE_TYPE_UVEC2:
		result = "uvec2";
		break;
	case VARIABLE_TYPE_UVEC3:
		result = "uvec3";
		break;
	case VARIABLE_TYPE_UVEC4:
		result = "uvec4";
		break;
	case VARIABLE_TYPE_VEC2:
		result = "vec2";
		break;
	case VARIABLE_TYPE_VEC3:
		result = "vec3";
		break;
	case VARIABLE_TYPE_VEC4:
		result = "vec4";
		break;

	default:
	{
		TCU_FAIL("Unrecognized variable type");
	}
	} /* switch (variable_type) */

	return result;
}